

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>
          (ThreadedReplayer *this,
          vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
          *deferred,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
          *parents,vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *work,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,uint start_index)

{
  size_type sVar1;
  uint local_314;
  anon_class_16_2_1526e6cf local_300;
  undefined1 local_2f0 [40];
  anon_class_56_7_ca1bbb61 local_2c8;
  undefined1 local_290 [40];
  anon_class_48_6_745bc604 local_268;
  undefined1 local_238 [40];
  anon_class_56_5_71294dfa local_210;
  undefined1 local_1d8 [40];
  anon_class_48_6_076d015d local_1b0;
  undefined1 local_180 [40];
  anon_class_40_4_a1b55aa8 local_158;
  undefined1 local_130 [40];
  anon_class_16_2_9ee12fb6 local_108;
  undefined1 local_f8 [40];
  anon_class_40_6_ee6c0a18 local_d0;
  undefined1 local_a8 [40];
  undefined1 local_80 [8];
  shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
  derived;
  uint to_submit;
  uint left_to_submit;
  uint hash_offset;
  shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  parsed_parents;
  anon_class_16_2_a18aa90e get_order_index;
  uint iteration;
  uint memory_index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes_local;
  vector<EnqueuedWork,_std::allocator<EnqueuedWork>_> *work_local;
  unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
  *parents_local;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *pipelines_local;
  vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
  *deferred_local;
  ThreadedReplayer *this_local;
  
  get_order_index.memory_index._4_4_ = 0;
  get_order_index.memory_index._0_4_ = 0;
  parsed_parents.
  super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&get_order_index.memory_index
  ;
  get_order_index.iteration = (uint *)((long)&get_order_index.memory_index + 4);
  std::
  make_shared<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ();
  for (to_submit = 0;
      sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(hashes),
      to_submit < sVar1; to_submit = to_submit + 0x400) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(hashes);
    local_314 = (int)sVar1 - to_submit;
    if (0x3ff < local_314) {
      local_314 = 0x400;
    }
    derived.
    super___shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ = local_314;
    std::
    make_shared<std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>>
              ();
    local_a8._0_4_ =
         enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
         anon_class_16_2_a18aa90e::operator()
                   ((anon_class_16_2_a18aa90e *)
                    &parsed_parents.
                     super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,0);
    local_d0.memory_index = get_order_index.memory_index._4_4_;
    local_d0.to_submit =
         derived.
         super___shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_;
    local_d0.hash_offset = to_submit;
    local_d0.this = this;
    local_d0.hashes = hashes;
    local_d0.deferred = deferred;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_1_,void>
              ((function<void()> *)(local_a8 + 8),&local_d0);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back(work,(value_type *)local_a8)
    ;
    EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_a8);
    if (get_order_index.memory_index._4_4_ == 0) {
      local_f8._0_4_ =
           enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
           anon_class_16_2_a18aa90e::operator()
                     ((anon_class_16_2_a18aa90e *)
                      &parsed_parents.
                       super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,1);
      local_108.this = this;
      local_108.parents = parents;
      std::function<void()>::
      function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_2_,void>
                ((function<void()> *)(local_f8 + 8),&local_108);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back
                (work,(value_type *)local_f8);
      EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_f8);
    }
    local_130._0_4_ =
         enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
         anon_class_16_2_a18aa90e::operator()
                   ((anon_class_16_2_a18aa90e *)
                    &parsed_parents.
                     super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,2);
    local_158.this = this;
    std::
    shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
    ::shared_ptr(&local_158.derived,
                 (shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
                  *)local_80);
    local_158.memory_index = get_order_index.memory_index._4_4_;
    local_158.deferred = deferred;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_3_,void>
              ((function<void()> *)(local_130 + 8),&local_158);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back
              (work,(value_type *)local_130);
    EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_130);
    enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)
    ::{lambda()#3}::~unordered_map((_lambda___3_ *)&local_158);
    local_180._0_4_ =
         enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
         anon_class_16_2_a18aa90e::operator()
                   ((anon_class_16_2_a18aa90e *)
                    &parsed_parents.
                     super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,3);
    local_1b0.this = this;
    std::
    shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
    ::shared_ptr(&local_1b0.derived,
                 (shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
                  *)local_80);
    local_1b0.memory_index = get_order_index.memory_index._4_4_;
    local_1b0.hash_offset = to_submit;
    local_1b0.start_index = start_index;
    local_1b0.deferred = deferred;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_4_,void>
              ((function<void()> *)(local_180 + 8),&local_1b0);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back
              (work,(value_type *)local_180);
    EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_180);
    enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)
    ::{lambda()#4}::~unordered_map((_lambda___4_ *)&local_1b0);
    local_1d8._0_4_ =
         enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
         anon_class_16_2_a18aa90e::operator()
                   ((anon_class_16_2_a18aa90e *)
                    &parsed_parents.
                     super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,4);
    local_210.this = this;
    local_210.pipelines = pipelines;
    local_210.parents = parents;
    std::
    shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
    ::shared_ptr(&local_210.derived,
                 (shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
                  *)local_80);
    std::
    shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::shared_ptr(&local_210.parsed_parents,
                 (shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                  *)&left_to_submit);
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_5_,void>
              ((function<void()> *)(local_1d8 + 8),&local_210);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back
              (work,(value_type *)local_1d8);
    EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_1d8);
    enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)
    ::{lambda()#5}::~unordered_map((_lambda___5_ *)&local_210);
    if (get_order_index.memory_index._4_4_ == 0) {
      local_238._0_4_ =
           enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
           anon_class_16_2_a18aa90e::operator()
                     ((anon_class_16_2_a18aa90e *)
                      &parsed_parents.
                       super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,5);
      local_268.this = this;
      local_268.pipelines = pipelines;
      local_268.parents = parents;
      std::
      shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
      ::shared_ptr(&local_268.parsed_parents,
                   (shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                    *)&left_to_submit);
      local_268.hash_offset = to_submit;
      local_268.start_index = start_index;
      std::function<void()>::
      function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_6_,void>
                ((function<void()> *)(local_238 + 8),&local_268);
      std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back
                (work,(value_type *)local_238);
      EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_238);
      enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)
      ::{lambda()#6}::~unordered_map((_lambda___6_ *)&local_268);
    }
    local_290._0_4_ =
         enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::
         anon_class_16_2_a18aa90e::operator()
                   ((anon_class_16_2_a18aa90e *)
                    &parsed_parents.
                     super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,6);
    local_2c8.this = this;
    local_2c8.pipelines = pipelines;
    std::
    shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
    ::shared_ptr(&local_2c8.derived,
                 (shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
                  *)local_80);
    local_2c8.memory_index = get_order_index.memory_index._4_4_;
    local_2c8.hash_offset = to_submit;
    local_2c8.start_index = start_index;
    local_2c8.parents = parents;
    std::function<void()>::
    function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_7_,void>
              ((function<void()> *)(local_290 + 8),&local_2c8);
    std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back
              (work,(value_type *)local_290);
    EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_290);
    enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)
    ::{lambda()#7}::~unordered_map((_lambda___7_ *)&local_2c8);
    get_order_index.memory_index._4_4_ = get_order_index.memory_index._4_4_ + 1 & 1;
    std::
    shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
    ::~shared_ptr((shared_ptr<std::vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>_>
                   *)local_80);
    get_order_index.memory_index._0_4_ = (int)get_order_index.memory_index + 1;
  }
  local_2f0._0_4_ =
       enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>::anon_class_16_2_a18aa90e
       ::operator()((anon_class_16_2_a18aa90e *)
                    &parsed_parents.
                     super___shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,0);
  local_300.memory_index = get_order_index.memory_index._4_4_;
  local_300.this = this;
  std::function<void()>::
  function<ThreadedReplayer::enqueue_deferred_pipelines<ThreadedReplayer::DeferredGraphicsInfo>(std::vector<ThreadedReplayer::DeferredGraphicsInfo,std::allocator<ThreadedReplayer::DeferredGraphicsInfo>>*,std::unordered_map<unsigned_long,VkPipeline_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkPipeline_T*>>>const&,std::unordered_map<unsigned_long,ThreadedReplayer::DeferredGraphicsInfo,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ThreadedReplayer::DeferredGraphicsInfo>>>&,std::vector<EnqueuedWork,std::allocator<EnqueuedWork>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_int)::_lambda()_8_,void>
            ((function<void()> *)(local_2f0 + 8),&local_300);
  std::vector<EnqueuedWork,_std::allocator<EnqueuedWork>_>::push_back(work,(value_type *)local_2f0);
  EnqueuedWork::~EnqueuedWork((EnqueuedWork *)local_2f0);
  std::
  shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  ::~shared_ptr((shared_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
                 *)&left_to_submit);
  return;
}

Assistant:

void enqueue_deferred_pipelines(vector<DerivedInfo> *deferred, const unordered_map<Hash, VkPipeline> &pipelines,
	                                unordered_map<Hash, DerivedInfo> &parents,
	                                vector<EnqueuedWork> &work, const vector<Hash> &hashes, unsigned start_index)
	{
		static const unsigned NUM_PIPELINES_PER_CONTEXT = 1024;

		// Make sure that if we sort by work_index, we get an interleaved execution pattern which
		// will naturally pipeline.
		enum PassOrder
		{
			PARSE_ENQUEUE_OFFSET = 0,
			MAINTAIN_LRU_CACHE = 1,
			ENQUEUE_SHADER_MODULES_PRIMARY_OFFSET = 2,
			RESOLVE_SHADER_MODULE_AND_ENQUEUE_PIPELINES_PRIMARY_OFFSET = 3,
			ENQUEUE_OUT_OF_RANGE_PARENT_PIPELINES = 4,
			ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET = 5,
			ENQUEUE_DERIVED_PIPELINES_OFFSET = 6,
			PASS_COUNT = 7
		};

		unsigned memory_index = 0;
		unsigned iteration = 0;

		// This makes sure that we interleave execution of N iterations. Essentially, we get an execution order:
		// - Pass 0, chunk 0 (context 0)
		// - Pass 0, chunk 1 (context 1)
		// - Pass 1, chunk 0 (context 0)
		// - Pass 1, chunk 1 (context 1)
		// - ...
		// - Pass 6, chunk 0 (reclaim memory for context 0)
		// - Pass 6, chunk 1 (reclaim memory for context 1)
		// - Pass 7, sync point
		// - Pass 0, chunk 2 (context 0)
		// - Pass 1, chunk 3 (context 1)

		const auto get_order_index = [&](unsigned pass) -> unsigned {
			return (iteration / NUM_PIPELINE_MEMORY_CONTEXTS) * PASS_COUNT * NUM_PIPELINE_MEMORY_CONTEXTS +
			       pass * NUM_PIPELINE_MEMORY_CONTEXTS +
			       memory_index;
		};

		auto parsed_parents = make_shared<unordered_set<Hash>>();

		for (unsigned hash_offset = 0; hash_offset < hashes.size(); hash_offset += NUM_PIPELINES_PER_CONTEXT, iteration++)
		{
			unsigned left_to_submit = hashes.size() - hash_offset;
			unsigned to_submit = left_to_submit < NUM_PIPELINES_PER_CONTEXT ? left_to_submit : NUM_PIPELINES_PER_CONTEXT;

			// State which is used between pipeline stages.
			auto derived = make_shared<vector<DerivedInfo>>();

			// Submit pipelines to be parsed.
			work.push_back({ get_order_index(PARSE_ENQUEUE_OFFSET),
			                 [this, &hashes, deferred, memory_index, to_submit, hash_offset]() {
				                 // Drain old allocators.
				                 sync_worker_memory_context(memory_index);
				                 // Reset per memory-context allocators.
				                 for (auto &data : per_thread_data)
				                 {
					                 if (data.per_thread_replayers)
					                 {
						                 data.per_thread_replayers[memory_index].get_allocator().reset();
						                 // We might have to replay the same pipeline multiple times,
						                 // forget handle references.
						                 data.per_thread_replayers[memory_index].forget_pipeline_handle_references();
					                 }
				                 }

				                 // Important that memory is cleared here since we yoinked away the memory
				                 // when resetting allocators.
				                 deferred[memory_index].clear();

				                 deferred[memory_index].resize(to_submit);

				                 for (unsigned index = hash_offset; index < hash_offset + to_submit; index++)
				                 {
					                 auto tag = DerivedInfo::get_tag();
					                 if (cached_blobs[tag].count(hashes[index]) != 0)
					                 {
						                 // Do not do anything with this pipeline.
						                 // Need to check here which is not optimal, since we need to maintain a stable pipeline index
						                 // for the robust replayer mechanism.
						                 // TODO: Consider pre-parsing various databases and emit a SHM block for child replayer processes.
						                 if (opts.control_block)
						                 {
							                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
							                 {
								                 opts.control_block->total_graphics.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_graphics.fetch_add(1, std::memory_order_relaxed);
							                 }
							                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
							                 {
								                 opts.control_block->total_compute.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_compute.fetch_add(1, std::memory_order_relaxed);
							                 }
							                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
							                 {
								                 opts.control_block->total_raytracing.fetch_add(1, std::memory_order_relaxed);
								                 opts.control_block->cached_raytracing.fetch_add(1, std::memory_order_relaxed);
							                 }
						                 }
					                 }
					                 else
					                 {
						                 // We are going to free all existing parent pipelines, so we cannot reuse
						                 // any pipeline that was already compiled.
						                 PipelineWorkItem work_item;
						                 work_item.hash = hashes[index];
						                 work_item.tag = DerivedInfo::get_tag();
						                 work_item.parse_only = true;
						                 work_item.memory_context_index = memory_index;
						                 work_item.index = index - hash_offset;

						                 if (opts.control_block)
						                 {
							                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
								                 opts.control_block->total_graphics.fetch_add(1, std::memory_order_relaxed);
							                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
								                 opts.control_block->total_compute.fetch_add(1, std::memory_order_relaxed);
							                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
								                 opts.control_block->total_raytracing.fetch_add(1, std::memory_order_relaxed);
						                 }

						                 enqueue_work_item(work_item);
					                 }
				                 }
			                 }});

			if (memory_index == 0)
			{
				work.push_back({ get_order_index(MAINTAIN_LRU_CACHE),
				                 [this, &parents]() {
					                 // Now all worker threads are drained for any work which needs shader modules,
					                 // so we can maintain the shader module LRU cache while we're parsing new pipelines in parallel.
					                 shader_modules.prune_cache([this](Hash hash, VkShaderModule module) {
						                 assert(enqueued_shader_modules.count((VkShaderModule) hash) != 0);
						                 //LOGI("Removing shader module %016llx.\n", static_cast<unsigned long long>(hash));
						                 enqueued_shader_modules.erase((VkShaderModule) hash);
						                 if (module != VK_NULL_HANDLE)
						                 {
							                 device->get_feature_filter().unregister_shader_module_info(module);
							                 vkDestroyShaderModule(device->get_device(), module, nullptr);
						                 }

						                 shader_module_evicted_count.fetch_add(1, std::memory_order_relaxed);
					                 });

					                 // Need to forget that we have seen an object before so we can replay the same object multiple times.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[SHADER_MODULE_MEMORY_CONTEXT].forget_handle_references();

									 // We also know that pipelines are not being compiled,
									 // so we can free pipelines.
									 // When using graphics pipeline libraries, most pipelines
									 // will be "parent" pipelines, which leads to excessive memory bloat
									 // if we keep them around indefinitely.
					                 free_pipelines();

					                 parents.clear();

					                 // We might have to replay the same pipeline multiple times,
					                 // forget handle references.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[PARENT_PIPELINE_MEMORY_CONTEXT].forget_pipeline_handle_references();
				                 }});
			}

			work.push_back({ get_order_index(ENQUEUE_SHADER_MODULES_PRIMARY_OFFSET),
			                 [this, derived, deferred, memory_index]() {
				                 // Make sure all parsing of pipelines is complete for this memory context.
				                 sync_worker_memory_context(memory_index);

				                 // Enqueue creation of all shader modules which are referenced by the pipelines.
				                 for (auto &item : deferred[memory_index])
					                 if (item.info)
						                 enqueue_shader_modules(item.info);

				                 // There are two primary kinds of pipelines, derived and non-derived. We split compilation in two here.
				                 // Non-derived pipelines have no dependencies on other pipelines, so we can go ahead,
				                 // and we force that parent pipeline candidates cannot also be derived, which simplifies a lot of things.
				                 // While decompressing modules, we can sort the pipeline infos here in parallel.
				                 sort_deferred_derived_pipelines(*derived, deferred[memory_index]);
			                 }});

			work.push_back({ get_order_index(RESOLVE_SHADER_MODULE_AND_ENQUEUE_PIPELINES_PRIMARY_OFFSET),
			                 [this, derived, deferred, memory_index, hash_offset, start_index]() {
				                 // Make sure all VkShaderModules have been queued and completed.
				                 // We reserve a special memory context for all shader modules since other memory indices
				                 // might queue up shader module work which we need in our memory index.
				                 // Remap VkShaderModule references from hashes to real handles and enqueue
				                 // all non-derived pipelines for work.
				                 sync_worker_memory_context(SHADER_MODULE_MEMORY_CONTEXT);

				                 for (auto &item : deferred[memory_index])
				                 {
					                 if (item.info)
					                 {
						                 resolve_shader_modules(item.info);
						                 enqueue_pipeline(item.hash, item.info, item.pipeline,
						                                  item.index + hash_offset + start_index, memory_index);
					                 }
				                 }
			                 }});

			work.push_back({ get_order_index(ENQUEUE_OUT_OF_RANGE_PARENT_PIPELINES),
			                 [this, &pipelines, &parents, derived, parsed_parents]() {
				                 // Figure out which of the parent pipelines we need.
				                 for (auto &d : *derived)
					                 enqueue_parent_pipelines(d, pipelines, parents, *parsed_parents);
			                 }});

			if (memory_index == 0)
			{
				// This is a join-like operation. We need to wait for all parent pipelines and all shader modules to have completed.
				work.push_back({get_order_index(ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET),
				                [this, &pipelines, &parents, parsed_parents, hash_offset, start_index]()
				                {
					                unordered_set<Hash> dependencies;
					                while (true)
					                {
						                // Wait until all parent pipelines have been parsed.
						                sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);

						                dependencies.clear();
						                std::swap(*parsed_parents, dependencies);

						                for (auto dependency : dependencies)
						                {
							                // Handle nested libraries.
							                enqueue_parent_pipelines(parents.at(dependency), pipelines, parents, *parsed_parents);
						                }

						                if (parsed_parents->empty())
							                break;
					                }

					                // Queue up all shader modules if somehow the shader modules used by parent pipelines differ from children ...
					                for (auto &parent : parents)
					                {
						                // If we enqueued something here, we have to wait for shader handles to resolve.
						                if (parent.second.info)
							                enqueue_shader_modules(parent.second.info);
					                }

					                if (opts.control_block)
					                {
						                auto tag = DerivedInfo::get_tag();
						                if (tag == RESOURCE_GRAPHICS_PIPELINE)
						                {
							                opts.control_block->total_graphics.fetch_add(parents.size(),
							                                                             std::memory_order_relaxed);
						                }
						                else if (tag == RESOURCE_COMPUTE_PIPELINE)
						                {
							                opts.control_block->total_compute.fetch_add(parents.size(),
							                                                            std::memory_order_relaxed);
						                }
						                else if (tag == RESOURCE_RAYTRACING_PIPELINE)
						                {
							                opts.control_block->total_raytracing.fetch_add(parents.size(),
							                                                               std::memory_order_relaxed);
						                }
					                }

					                sync_worker_memory_context(SHADER_MODULE_MEMORY_CONTEXT);

					                unordered_map<Hash, uint32_t> parents_depth;

					                dependencies.clear();
					                for (const auto &parent : parents)
					                {
						                parents_depth[parent.first] = 0;

						                auto library = work_item_get_library_info(parent.second);
						                if (!library)
							                continue;

						                for (uint32_t i = 0; i < library->libraryCount; i++)
							                dependencies.insert((Hash)library->pLibraries[i]);
					                }

					                // Compute the depth of every pipeline library using a DFS starting at the top level libraries.
					                vector<DerivedInfo> ordered_parents; 
					                for (const auto &parent : parents)
					                {
						                ordered_parents.push_back(parent.second);

						                if (dependencies.count(parent.first) == 0)
							                compute_parents_depth(parents, parents_depth, parent.second, 0);
					                }

					                sort(begin(ordered_parents), end(ordered_parents), [&](const DerivedInfo &a, const DerivedInfo &b) -> bool {
						                return parents_depth.at(a.hash) > parents_depth.at(b.hash);
					                });

					                // We might be pulling in a parent pipeline from another memory context next iteration,
					                // so we need to wait for all normal memory contexts.
					                for (unsigned i = 0; i < NUM_PIPELINE_MEMORY_CONTEXTS; i++)
						                sync_worker_memory_context(i);

					                uint32_t prev_depth = UINT32_MAX;
					                for (auto &parent : ordered_parents)
					                {
						                if (!parent.info)
							                continue;

						                if (!derived_work_item_is_satisfied(parent, pipelines))
							                continue;

						                uint32_t depth = parents_depth.at(parent.hash);
						                if (prev_depth != depth)
						                {
							                prev_depth = depth;
							                sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);
						                }

						                resolve_shader_modules(parent.info);
						                resolve_pipelines(parent, pipelines);
						                enqueue_pipeline(parent.hash, parent.info,
						                                 parent.pipeline,
						                                 parent.index + hash_offset + start_index,
						                                 PARENT_PIPELINE_MEMORY_CONTEXT);
					                }
				                }});
			}

			work.push_back({ get_order_index(ENQUEUE_DERIVED_PIPELINES_OFFSET),
			                 [this, &pipelines, derived, &parents, memory_index, hash_offset, start_index]() {
				                 // Go over all pipelines. If there are no further dependencies to resolve, we can go ahead and queue them up.
				                 // If an entry exists in pipelines, we have queued up that hash earlier, but it might not be done compiling yet.
				                 auto itr = unstable_remove_if(begin(*derived), end(*derived), [&](const DerivedInfo &info) -> bool {
					                 return derived_work_item_is_satisfied(info, pipelines) || parents.count(info.hash) != 0;
				                 });

				                 // Wait for parent pipelines to complete.
				                 // Only needed for first memory index.
				                 if (memory_index == 0)
				                 {
					                 sync_worker_memory_context(PARENT_PIPELINE_MEMORY_CONTEXT);

					                 // Now we have replayed the pipelines, so we can reclaim parent pipeline memory for this iteration.
					                 for (auto &per_thread : per_thread_data)
						                 if (per_thread.per_thread_replayers)
							                 per_thread.per_thread_replayers[PARENT_PIPELINE_MEMORY_CONTEXT].get_allocator().reset();
				                 }

				                 // Now we can enqueue pipeline compilation with correct pipeline handles.
				                 for (auto i = itr; i != end(*derived); ++i)
				                 {
					                 // itr always removes parent pipelines because they were already compiled
					                 // in ENQUEUE_SHADER_MODULE_SECONDARY_OFFSET. This way they do not count
					                 // as skipped, but it also means that we need to skip them here to avoid
					                 // compiling them twice.
					                 if (i->info && parents.count(i->hash) == 0)
					                 {
						                 resolve_shader_modules(i->info);
						                 resolve_pipelines(*i, pipelines);
						                 enqueue_pipeline(i->hash, i->info, i->pipeline,
						                                  i->index + hash_offset + start_index, memory_index);
					                 }
				                 }

				                 // It might be possible that we couldn't resolve some dependencies, log this.
				                 if (itr != begin(*derived))
				                 {
					                 auto skipped_count = unsigned(itr - begin(*derived));
					                 LOGW("%u pipelines were not compiled because parent pipelines do not exist.\n", skipped_count);

					                 if (opts.control_block)
					                 {
						                 auto tag = DerivedInfo::get_tag();
						                 if (tag == RESOURCE_GRAPHICS_PIPELINE)
							                 opts.control_block->skipped_graphics.fetch_add(skipped_count, std::memory_order_relaxed);
						                 else if (tag == RESOURCE_COMPUTE_PIPELINE)
							                 opts.control_block->skipped_compute.fetch_add(skipped_count, std::memory_order_relaxed);
						                 else if (tag == RESOURCE_RAYTRACING_PIPELINE)
							                 opts.control_block->skipped_raytracing.fetch_add(skipped_count, std::memory_order_relaxed);
					                 }
				                 }
			                 }});

			memory_index = (memory_index + 1) % NUM_PIPELINE_MEMORY_CONTEXTS;
		}

		// If the last work happens in memory context 0, we won't sync up memory context 1 properly.
		// Ensure that happens properly.
		work.push_back({ get_order_index(PARSE_ENQUEUE_OFFSET),
		                 [this, memory_index]() { sync_worker_memory_context(memory_index); }});
	}